

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  ImGuiTableColumn *pIVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  char *pcVar8;
  char *label;
  int iVar9;
  long lVar10;
  bool enabled;
  uint uVar7;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    iVar3 = (int)table->ContextPopupColumn;
    iVar9 = -1;
    if ((table->ContextPopupColumn < '\0') || (table->ColumnsCount <= iVar3)) {
      pIVar2 = (ImGuiTableColumn *)0x0;
    }
    else {
      pIVar2 = (table->Columns).Data + iVar3;
      iVar9 = iVar3;
    }
    uVar7 = table->Flags & 1;
    cVar6 = (char)uVar7;
    if (uVar7 != 0) {
      if (pIVar2 != (ImGuiTableColumn *)0x0) {
        if ((pIVar2->Flags & 0x10) == 0) {
          bVar1 = pIVar2->IsEnabled;
        }
        else {
          bVar1 = false;
        }
        bVar1 = MenuItem("Size column to fit###SizeOne",(char *)0x0,false,bVar1);
        if (bVar1) {
          pIVar2 = (table->Columns).Data;
          if (pIVar2[iVar9].IsEnabled == true) {
            pIVar2[iVar9].CannotSkipItemsQueue = '\x01';
            table->AutoFitSingleColumn = (ImGuiTableColumnIdx)iVar9;
          }
        }
      }
      if ((table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount) &&
         ((table->Flags & 0xe000U) != 0x4000)) {
        pcVar8 = "Size all columns to fit###SizeAll";
      }
      else {
        pcVar8 = "Size all columns to default###SizeAll";
      }
      bVar1 = MenuItem(pcVar8,(char *)0x0,false,true);
      if ((bVar1) && (iVar9 = table->ColumnsCount, 0 < (long)iVar9)) {
        pIVar2 = (table->Columns).Data;
        lVar5 = 0;
        do {
          if (((&pIVar2->IsEnabled)[lVar5] != false) ||
             ((*(byte *)((long)&pIVar2->Flags + lVar5) & 4) != 0)) {
            *(undefined2 *)(&pIVar2->AutoFitQueue + lVar5) = 0x102;
          }
          lVar5 = lVar5 + 0x68;
        } while ((long)iVar9 * 0x68 - lVar5 != 0);
      }
    }
    if ((table->Flags & 2) != 0) {
      bVar1 = MenuItem("Reset order",(char *)0x0,false,(bool)(table->IsDefaultDisplayOrder ^ 1));
      cVar6 = '\x01';
      if (bVar1) {
        table->IsResetDisplayOrderRequest = true;
      }
    }
    if ((table->Flags & 4) != 0) {
      if (cVar6 != '\0') {
        Separator();
      }
      PushItemFlag(0x20,true);
      if (0 < table->ColumnsCount) {
        lVar5 = 0x5b;
        lVar10 = 0;
        do {
          pIVar2 = (table->Columns).Data;
          if ((table->IsLayoutLocked == false) && (pcVar8 = "", table->DeclColumnsCount <= lVar10))
          {
LAB_0017a097:
            label = "<Unknown>";
            if (*pcVar8 != '\0') {
              label = pcVar8;
            }
          }
          else {
            lVar4 = (long)*(short *)((long)pIVar2 + lVar5 + -0xb);
            pcVar8 = "";
            if (lVar4 == -1) goto LAB_0017a097;
            pcVar8 = (table->ColumnsNames).Buf.Data;
            label = "<Unknown>";
            if (pcVar8 != (char *)0x0) {
              pcVar8 = pcVar8 + lVar4;
              goto LAB_0017a097;
            }
          }
          uVar7 = *(uint *)((long)pIVar2 + lVar5 + -0x5b);
          enabled = (uVar7 & 0x40) == 0;
          bVar1 = *(bool *)((long)pIVar2 + lVar5 + -1);
          if (bVar1 == true) {
            enabled = '\x01' < table->ColumnsEnabledCount && (uVar7 & 0x40) == 0;
          }
          bVar1 = MenuItem(label,(char *)0x0,bVar1,enabled);
          if (bVar1) {
            *(byte *)((long)&pIVar2->Flags + lVar5) = *(byte *)((long)pIVar2 + lVar5 + -1) ^ 1;
          }
          lVar10 = lVar10 + 1;
          lVar5 = lVar5 + 0x68;
        } while (lVar10 < table->ColumnsCount);
      }
      PopItemFlag();
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem("Size column to fit###SizeOne", NULL, false, can_resize))
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = "Size all columns to fit###SizeAll";        // All fixed
        else
            size_all_desc = "Size all columns to default###SizeAll";    // All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem("Reset order", NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsEnabled, menu_item_active))
                other_column->IsEnabledNextFrame = !other_column->IsEnabled;
        }
        PopItemFlag();
    }
}